

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyscope.cpp
# Opt level: O0

void polyscope::draw(bool withUI,bool withContextCallback)

{
  vec3 c;
  bool bVar1;
  reference pvVar2;
  byte in_SIL;
  byte in_DIL;
  Widget *w_1;
  WeakHandle<polyscope::Widget> wHandle_1;
  iterator __end2;
  iterator __begin2;
  vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>
  *__range2;
  Widget *w;
  WeakHandle<polyscope::Widget> wHandle;
  iterator __end4;
  iterator __begin4;
  vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>
  *__range4;
  undefined4 in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff0c;
  Engine *in_stack_ffffffffffffff10;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 in_stack_ffffffffffffff2c;
  undefined8 in_stack_ffffffffffffff30;
  WeakHandle<polyscope::Widget> local_a8;
  WeakHandle<polyscope::Widget> *local_88;
  __normal_iterator<polyscope::WeakHandle<polyscope::Widget>_*,_std::vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>_>
  local_80;
  undefined1 *local_78;
  Widget *local_70;
  WeakHandle<polyscope::Widget> local_58;
  WeakHandle<polyscope::Widget> *local_38;
  __normal_iterator<polyscope::WeakHandle<polyscope::Widget>_*,_std::vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>_>
  local_30;
  undefined1 *local_28;
  undefined8 local_20;
  undefined4 local_18;
  undefined8 local_10;
  undefined4 local_8;
  byte local_2;
  byte local_1;
  
  local_1 = in_DIL & 1;
  local_2 = in_SIL & 1;
  processLazyProperties();
  (**(code **)(*render::engine + 0x70))();
  (**(code **)(*render::engine + 0x10))();
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_10,0.0,0.0,0.0);
  local_18 = local_8;
  local_20 = local_10;
  c.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
              (int)in_stack_ffffffffffffff30;
  c.field_2 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)
              (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  c.field_0 = in_stack_ffffffffffffff2c;
  render::Engine::setBackgroundColor(in_stack_ffffffffffffff10,c);
  render::Engine::setBackgroundAlpha(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  (**(code **)(*render::engine + 8))();
  if ((local_1 & 1) != 0) {
    (**(code **)(*render::engine + 0xf8))();
  }
  if ((((local_1 & 1) != 0) &&
      (pvVar2 = std::
                vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
                ::back((vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
                        *)in_stack_ffffffffffffff10), (pvVar2->drawDefaultUI & 1U) != 0)) &&
     (buildUserGuiAndInvokeCallback(), (options::buildGui & 1) != 0)) {
    if ((options::buildDefaultGuiPanels & 1) != 0) {
      buildPolyscopeGui();
      buildStructureGui();
      buildPickGui();
    }
    local_28 = state::widgets;
    local_30._M_current =
         (WeakHandle<polyscope::Widget> *)
         std::
         vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>
         ::begin((vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    local_38 = (WeakHandle<polyscope::Widget> *)
               std::
               vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>
               ::end((vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<polyscope::WeakHandle<polyscope::Widget>_*,_std::vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>_>
                               *)in_stack_ffffffffffffff10,
                              (__normal_iterator<polyscope::WeakHandle<polyscope::Widget>_*,_std::vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
          bVar1) {
      __gnu_cxx::
      __normal_iterator<polyscope::WeakHandle<polyscope::Widget>_*,_std::vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>_>
      ::operator*(&local_30);
      WeakHandle<polyscope::Widget>::WeakHandle
                ((WeakHandle<polyscope::Widget> *)in_stack_ffffffffffffff10,
                 (WeakHandle<polyscope::Widget> *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      bVar1 = GenericWeakHandle::isValid((GenericWeakHandle *)0x3a67d3);
      if (bVar1) {
        local_70 = WeakHandle<polyscope::Widget>::get(&local_58);
        (*local_70->_vptr_Widget[4])();
      }
      WeakHandle<polyscope::Widget>::~WeakHandle((WeakHandle<polyscope::Widget> *)0x3a684c);
      __gnu_cxx::
      __normal_iterator<polyscope::WeakHandle<polyscope::Widget>_*,_std::vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>_>
      ::operator++(&local_30);
    }
  }
  if ((local_2 & 1) != 0) {
    std::
    vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
    ::back((vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
            *)in_stack_ffffffffffffff10);
    bVar1 = std::function::operator_cast_to_bool((function<void_()> *)0x3a6886);
    if (bVar1) {
      std::
      vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
      ::back((vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
              *)in_stack_ffffffffffffff10);
      std::function<void_()>::operator()((function<void_()> *)in_stack_ffffffffffffff10);
    }
  }
  processLazyProperties();
  if ((((anonymous_namespace)::redrawNextFrame & 1) != 0) || ((options::alwaysRedraw & 1) != 0)) {
    anon_unknown_1::renderScene();
    (anonymous_namespace)::redrawNextFrame = 0;
  }
  anon_unknown_1::renderSceneToScreen();
  if ((local_1 & 1) != 0) {
    (**(code **)(*render::engine + 0x10))();
    local_78 = state::widgets;
    local_80._M_current =
         (WeakHandle<polyscope::Widget> *)
         std::
         vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>
         ::begin((vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    local_88 = (WeakHandle<polyscope::Widget> *)
               std::
               vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>
               ::end((vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<polyscope::WeakHandle<polyscope::Widget>_*,_std::vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>_>
                               *)in_stack_ffffffffffffff10,
                              (__normal_iterator<polyscope::WeakHandle<polyscope::Widget>_*,_std::vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
          bVar1) {
      __gnu_cxx::
      __normal_iterator<polyscope::WeakHandle<polyscope::Widget>_*,_std::vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>_>
      ::operator*(&local_80);
      WeakHandle<polyscope::Widget>::WeakHandle
                ((WeakHandle<polyscope::Widget> *)in_stack_ffffffffffffff10,
                 (WeakHandle<polyscope::Widget> *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      bVar1 = GenericWeakHandle::isValid((GenericWeakHandle *)0x3a695c);
      if (bVar1) {
        in_stack_ffffffffffffff10 = (Engine *)WeakHandle<polyscope::Widget>::get(&local_a8);
        (*in_stack_ffffffffffffff10->_vptr_Engine[2])();
      }
      WeakHandle<polyscope::Widget>::~WeakHandle((WeakHandle<polyscope::Widget> *)0x3a69c3);
      __gnu_cxx::
      __normal_iterator<polyscope::WeakHandle<polyscope::Widget>_*,_std::vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>_>
      ::operator++(&local_80);
    }
    (**(code **)(*render::engine + 0x10))();
    (**(code **)(*render::engine + 0x100))();
  }
  return;
}

Assistant:

void draw(bool withUI, bool withContextCallback) {
  processLazyProperties();

  // Update buffer and context
  render::engine->makeContextCurrent();
  render::engine->bindDisplay();
  render::engine->setBackgroundColor({0., 0., 0.});
  render::engine->setBackgroundAlpha(0);
  render::engine->clearDisplay();

  if (withUI) {
    render::engine->ImGuiNewFrame();
  }

  // Build the GUI components
  if (withUI) {
    if (contextStack.back().drawDefaultUI) {

      // Note: It is important to build the user GUI first, because it is likely that callbacks there will modify
      // polyscope data. If we do these modifications happen later in the render cycle, they might invalidate data which
      // is necessary when ImGui::Render() happens below.
      buildUserGuiAndInvokeCallback();

      if (options::buildGui) {
        if (options::buildDefaultGuiPanels) {
          buildPolyscopeGui();
          buildStructureGui();
          buildPickGui();
        }

        for (WeakHandle<Widget> wHandle : state::widgets) {
          if (wHandle.isValid()) {
            Widget& w = wHandle.get();
            w.buildGUI();
          }
        }
      }
    }
  }

  // Execute the context callback, if there is one.
  // This callback is a Polyscope implementation detail, which is distinct from the userCallback (which gets called
  // above)
  if (withContextCallback && contextStack.back().callback) {
    (contextStack.back().callback)();
  }

  processLazyProperties();

  // Draw structures in the scene
  if (redrawNextFrame || options::alwaysRedraw) {
    renderScene();
    redrawNextFrame = false;
  }
  renderSceneToScreen();

  // Draw the GUI
  if (withUI) {
    // render widgets
    render::engine->bindDisplay();
    for (WeakHandle<Widget> wHandle : state::widgets) {
      if (wHandle.isValid()) {
        Widget& w = wHandle.get();
        w.draw();
      }
    }

    render::engine->bindDisplay();
    render::engine->ImGuiRender();
  }
}